

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_meta.c
# Opt level: O1

TValue * lj_meta_equal(lua_State *L,GCobj *o1,GCobj *o2,int ne)

{
  byte bVar1;
  uint uVar2;
  bool bVar3;
  cTValue *pcVar4;
  cTValue *pcVar5;
  ulong uVar6;
  TValue *pTVar7;
  code *pcVar8;
  GCtab *pGVar9;
  
  pGVar9 = (GCtab *)(ulong)(o1->gch).metatable.gcptr32;
  if ((pGVar9 == (GCtab *)0x0) || ((pGVar9->nomm & 0x10) != 0)) {
    pcVar4 = (cTValue *)0x0;
  }
  else {
    pcVar4 = lj_meta_cache(pGVar9,MM_eq,(GCstr *)(ulong)*(uint *)((ulong)(L->glref).ptr32 + 0x110));
  }
  if (pcVar4 == (cTValue *)0x0) {
    return (TValue *)(long)ne;
  }
  uVar2 = (o2->gch).metatable.gcptr32;
  pGVar9 = (GCtab *)(ulong)uVar2;
  if ((o1->gch).metatable.gcptr32 == uVar2) goto LAB_0010b958;
  if ((pGVar9 == (GCtab *)0x0) || ((pGVar9->nomm & 0x10) != 0)) {
    pcVar5 = (cTValue *)0x0;
  }
  else {
    pcVar5 = lj_meta_cache(pGVar9,MM_eq,(GCstr *)(ulong)*(uint *)((ulong)(L->glref).ptr32 + 0x110));
  }
  if (pcVar5 == (cTValue *)0x0) {
LAB_0010b94f:
    pcVar5 = (cTValue *)(long)ne;
    bVar3 = false;
  }
  else {
    uVar2 = (pcVar4->field_2).it;
    if (uVar2 != (pcVar5->field_2).it) {
      if ((uVar2 < 0xffff0000) && ((pcVar5->field_2).it < 0xffff0000)) {
LAB_0010b934:
        pcVar5 = (cTValue *)(ulong)(-(uint)(pcVar5->n == pcVar4->n) & 1);
        goto LAB_0010b947;
      }
      goto LAB_0010b94f;
    }
    if (uVar2 < 0xfffffffd) {
      if (uVar2 < 0xfffeffff) goto LAB_0010b934;
      pcVar5 = (cTValue *)CONCAT71((int7)((ulong)pcVar5 >> 8),(pcVar4->u32).lo == (pcVar5->u32).lo);
LAB_0010b947:
      if ((char)pcVar5 == '\0') goto LAB_0010b94f;
    }
    bVar3 = true;
  }
  if (!bVar3) {
    return pcVar5;
  }
LAB_0010b958:
  uVar6 = (ulong)L->base[-1].u32.lo;
  if (*(char *)(uVar6 + 6) == '\0') {
    pTVar7 = L->base + *(byte *)((ulong)*(uint *)(uVar6 + 0x10) - 0x39);
  }
  else {
    pTVar7 = L->top;
  }
  pcVar8 = lj_cont_condf;
  if (ne == 0) {
    pcVar8 = lj_cont_condt;
  }
  pTVar7->u64 = (uint64_t)(pcVar8 + -0x14e0c0);
  pTVar7[1].u32 = *(anon_struct_8_2_f9ee98fb_for_u32 *)pcVar4;
  bVar1 = (o1->gch).gct;
  pTVar7[2].u32.lo = (uint32_t)o1;
  *(uint *)((long)pTVar7 + 0x14) = ~(uint)bVar1;
  pTVar7[3].u32.lo = (uint32_t)o2;
  *(uint *)((long)pTVar7 + 0x1c) = ~(uint)bVar1;
  return pTVar7 + 2;
}

Assistant:

TValue *lj_meta_equal(lua_State *L, GCobj *o1, GCobj *o2, int ne)
{
  /* Field metatable must be at same offset for GCtab and GCudata! */
  cTValue *mo = lj_meta_fast(L, tabref(o1->gch.metatable), MM_eq);
  if (mo) {
    TValue *top;
    uint32_t it;
    if (tabref(o1->gch.metatable) != tabref(o2->gch.metatable)) {
      cTValue *mo2 = lj_meta_fast(L, tabref(o2->gch.metatable), MM_eq);
      if (mo2 == NULL || !lj_obj_equal(mo, mo2))
	return (TValue *)(intptr_t)ne;
    }
    top = curr_top(L);
    setcont(top, ne ? lj_cont_condf : lj_cont_condt);
    copyTV(L, top+1, mo);
    it = ~(uint32_t)o1->gch.gct;
    setgcV(L, top+2, o1, it);
    setgcV(L, top+3, o2, it);
    return top+2;  /* Trigger metamethod call. */
  }
  return (TValue *)(intptr_t)ne;
}